

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::InstructionFolder::FoldScalars
          (InstructionFolder *this,Op opcode,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *operands)

{
  pointer this_00;
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  undefined4 extraout_var;
  size_type sVar4;
  const_reference __x;
  long lVar5;
  value_type local_6c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *scalar_words;
  ScalarConstant *scalar;
  Constant **operand;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *__range2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> operand_values_in_raw_words;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *operands_local;
  Op opcode_local;
  InstructionFolder *this_local;
  
  operand_values_in_raw_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)operands;
  bVar1 = IsFoldableOpcode(this,opcode);
  if (!bVar1) {
    __assert_fail("IsFoldableOpcode(opcode) && \"Unhandled instruction opcode in FoldScalars\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold.cpp"
                  ,0xd2,
                  "uint32_t spvtools::opt::InstructionFolder::FoldScalars(spv::Op, const std::vector<const analysis::Constant *> &) const"
                 );
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
  this_00 = operand_values_in_raw_words.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  __end2 = std::
           vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
           ::begin((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                    *)operand_values_in_raw_words.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  operand = (Constant **)
            std::
            vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            ::end((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                   *)this_00);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_spvtools::opt::analysis::Constant_*const_*,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
                                *)&operand);
    if (!bVar1) {
      uVar3 = OperateWords(this,opcode,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
      return uVar3;
    }
    scalar = (ScalarConstant *)
             __gnu_cxx::
             __normal_iterator<const_spvtools::opt::analysis::Constant_*const_*,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
             ::operator*(&__end2);
    iVar2 = (*((Constant *)(scalar->super_Constant)._vptr_Constant)->_vptr_Constant[0xd])();
    scalar_words = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(extraout_var,iVar2);
    if (scalar_words == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      lVar5 = (**(code **)(*(scalar->super_Constant)._vptr_Constant + 0xb0))();
      if (lVar5 == 0) {
        __assert_fail("false && \"FoldScalars() only accepts ScalarConst or NullConst type of \" \"constant\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold.cpp"
                      ,0xe0,
                      "uint32_t spvtools::opt::InstructionFolder::FoldScalars(spv::Op, const std::vector<const analysis::Constant *> &) const"
                     );
      }
      local_6c = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2,&local_6c);
    }
    else {
      local_68 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 (**(code **)((scalar_words->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start + 0x30))();
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_68);
      if (sVar4 != 1) {
        __assert_fail("scalar_words.size() == 1 && \"Scalar constants with longer than 32-bit width are not allowed \" \"in FoldScalars()\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold.cpp"
                      ,0xd9,
                      "uint32_t spvtools::opt::InstructionFolder::FoldScalars(spv::Op, const std::vector<const analysis::Constant *> &) const"
                     );
      }
      __x = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(local_68);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2,__x);
    }
    __gnu_cxx::
    __normal_iterator<const_spvtools::opt::analysis::Constant_*const_*,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

uint32_t InstructionFolder::FoldScalars(
    spv::Op opcode,
    const std::vector<const analysis::Constant*>& operands) const {
  assert(IsFoldableOpcode(opcode) &&
         "Unhandled instruction opcode in FoldScalars");
  std::vector<uint32_t> operand_values_in_raw_words;
  for (const auto& operand : operands) {
    if (const analysis::ScalarConstant* scalar = operand->AsScalarConstant()) {
      const auto& scalar_words = scalar->words();
      assert(scalar_words.size() == 1 &&
             "Scalar constants with longer than 32-bit width are not allowed "
             "in FoldScalars()");
      operand_values_in_raw_words.push_back(scalar_words.front());
    } else if (operand->AsNullConstant()) {
      operand_values_in_raw_words.push_back(0u);
    } else {
      assert(false &&
             "FoldScalars() only accepts ScalarConst or NullConst type of "
             "constant");
    }
  }
  return OperateWords(opcode, operand_values_in_raw_words);
}